

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

int __thiscall asl::String::Enumerator::operator*(Enumerator *this)

{
  byte bVar1;
  byte bVar2;
  char *pcVar3;
  uint uVar4;
  
  pcVar3 = this->u;
  uVar4 = (uint)*pcVar3;
  if (-1 < *pcVar3) {
    this->n = 1;
    return uVar4;
  }
  if ((uVar4 & 0xe0) == 0xc0) {
    bVar1 = pcVar3[1];
    if (bVar1 != 0) {
      this->n = 2;
      return (uVar4 & 0x1f) << 6 | bVar1 & 0x3f;
    }
  }
  else if ((uVar4 & 0xf0) == 0xe0) {
    bVar1 = pcVar3[1];
    if (bVar1 != 0) {
      bVar2 = pcVar3[2];
      if (bVar2 != 0) {
        this->n = 3;
        return bVar2 & 0x3f | (bVar1 & 0x3f) << 6 | (uVar4 & 0xf) << 0xc;
      }
LAB_00120169:
      this->n = 2;
      return 0;
    }
  }
  else {
    this->n = 4;
    if (pcVar3[1] != 0) {
      if (pcVar3[2] != 0) {
        if (pcVar3[3] == 0) {
          this->n = 3;
          return 0;
        }
        return (byte)pcVar3[3] & 0x3f |
               ((byte)pcVar3[2] & 0x3f) << 6 | ((byte)pcVar3[1] & 0x3f) << 0xc | (uVar4 & 7) << 0x12
        ;
      }
      goto LAB_00120169;
    }
  }
  this->n = 1;
  return 0;
}

Assistant:

int String::Enumerator::operator*()
{
#ifdef ASL_ANSI
	n = 1;
	return (int)(byte)u[0];
#else
	char c = u[0];
	if((c & 0x80) == 0) {
		n = 1;
		return c;
	}
	else if ((c & 0xe0) == 0xc0) {
		char c2 = u[1];
		if (c2 == 0) { n = 1; return 0; }
		n = 2;
		return ((c & 0x1f) << 6) | (c2 & 0x3f);
	}
	else if ((c & 0xf0) == 0xe0) {
		char c2 = u[1];
		if (c2 == 0) { n = 1; return 0; }
		char c3 = u[2];
		if (c3 == 0) { n = 2; return 0; }
		n = 3;
		return ((c & 0x0f) << 12) | ((c2 & 0x3f) << 6) | (c3 & 0x3f);
	}
	else {
		n = 4;
		char c2 = u[1];
		if (c2 == 0) { n = 1; return 0; }
		char c3 = u[2];
		if (c3 == 0) { n = 2; return 0; }
		char c4 = u[3];
		if (c4 == 0) { n = 3; return 0; }
		return ((c & 0x07) << 18) | ((c2 & 0x3f) << 12) | ((c3 & 0x3f) << 6) | (c4 & 0x3f);
	}
#endif
}